

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::setPlainText(QTextDocument *this,QString *text)

{
  undefined1 uVar1;
  QTextDocumentPrivate *this_00;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  bool previousState;
  QTextDocumentPrivate *d;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  QTextDocument *document;
  undefined7 in_stack_ffffffffffffffd0;
  QTextDocumentPrivate *this_01;
  
  uVar2 = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  this_01 = *(QTextDocumentPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextDocument *)0x7ac75f);
  uVar1 = QTextDocumentPrivate::isUndoRedoEnabled(this_00);
  QTextDocumentPrivate::enableUndoRedo
            ((QTextDocumentPrivate *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),(bool)uVar2);
  QTextDocumentPrivate::beginEditBlock(this_00);
  QTextDocumentPrivate::clear(this_01);
  document = (QTextDocument *)&stack0xfffffffffffffff0;
  QTextCursor::QTextCursor((QTextCursor *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),document);
  QTextCursor::insertText((QTextCursor *)document,(QString *)in_RDI);
  uVar2 = (undefined1)((ulong)document >> 0x38);
  QTextCursor::~QTextCursor((QTextCursor *)0x7ac7bf);
  QTextDocumentPrivate::endEditBlock(in_RDI);
  QTextDocumentPrivate::enableUndoRedo
            ((QTextDocumentPrivate *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),(bool)uVar2);
  if (*(QTextDocumentPrivate **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setPlainText(const QString &text)
{
    Q_D(QTextDocument);
    bool previousState = d->isUndoRedoEnabled();
    d->enableUndoRedo(false);
    d->beginEditBlock();
    d->clear();
    QTextCursor(this).insertText(text);
    d->endEditBlock();
    d->enableUndoRedo(previousState);
}